

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cpp
# Opt level: O3

void __thiscall Section::Section(Section *this,string *left,string *right)

{
  long lVar1;
  pointer pcVar2;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  (this->m_left)._M_dataplus._M_p = (pointer)&(this->m_left).field_2;
  pcVar2 = (left->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>((string *)this,pcVar2,pcVar2 + left->_M_string_length);
  (this->m_right)._M_dataplus._M_p = (pointer)&(this->m_right).field_2;
  pcVar2 = (right->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->m_right,pcVar2,pcVar2 + right->_M_string_length);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

Section(const std::string& left, const std::string& right)
        : m_left{left}, m_right{right} {}